

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

ssize_t sftp_bin2attr(LIBSSH2_SFTP_ATTRIBUTES *attrs,uchar *p,size_t data_len)

{
  int iVar1;
  ulong uVar2;
  ssize_t sVar3;
  uint uVar4;
  uint32_t uid;
  uint32_t gid;
  uint32_t extended_count;
  uint32_t flags;
  string_buf buf;
  uchar *edata;
  size_t edata_len;
  
  flags = 0;
  buf.data = p;
  buf.dataptr = p;
  buf.len = data_len;
  iVar1 = _libssh2_get_u32(&buf,&flags);
  sVar3 = -0x26;
  if (iVar1 == 0) {
    uVar2 = (ulong)flags;
    attrs->flags = uVar2;
    if ((flags & 1) != 0) {
      iVar1 = _libssh2_get_u64(&buf,&attrs->filesize);
      if (iVar1 != 0) {
        return -0x26;
      }
      uVar2 = attrs->flags;
    }
    if ((uVar2 & 2) != 0) {
      uid = 0;
      gid = 0;
      iVar1 = _libssh2_get_u32(&buf,&uid);
      if (iVar1 != 0) {
        return -0x26;
      }
      iVar1 = _libssh2_get_u32(&buf,&gid);
      if (iVar1 != 0) {
        return -0x26;
      }
      attrs->uid = (ulong)uid;
      attrs->gid = (ulong)gid;
      uVar2 = attrs->flags;
    }
    if ((uVar2 & 4) != 0) {
      iVar1 = _libssh2_get_u32(&buf,&uid);
      if (iVar1 != 0) {
        return -0x26;
      }
      attrs->permissions = (ulong)uid;
      uVar2 = attrs->flags;
    }
    iVar1 = (int)uVar2;
    if ((uVar2 & 8) != 0) {
      iVar1 = _libssh2_get_u32(&buf,&uid);
      if (iVar1 != 0) {
        return -0x26;
      }
      iVar1 = _libssh2_get_u32(&buf,&gid);
      if (iVar1 != 0) {
        return -0x26;
      }
      attrs->atime = (ulong)uid;
      attrs->mtime = (ulong)gid;
      iVar1 = (int)attrs->flags;
    }
    if (iVar1 < 0) {
      iVar1 = _libssh2_get_u32(&buf,&extended_count);
      if (iVar1 == 0) {
        uVar4 = 0xffffffff;
        do {
          uVar4 = uVar4 + 1;
          if (extended_count <= uVar4) goto LAB_00126bf6;
          iVar1 = _libssh2_get_string(&buf,(uchar **)&gid,(size_t *)&uid);
        } while ((iVar1 == 0) && (iVar1 = _libssh2_get_string(&buf,&edata,&edata_len), iVar1 == 0));
      }
    }
    else {
LAB_00126bf6:
      sVar3 = (long)buf.dataptr - (long)buf.data;
    }
  }
  return sVar3;
}

Assistant:

static ssize_t
sftp_bin2attr(LIBSSH2_SFTP_ATTRIBUTES *attrs, const unsigned char *p,
              size_t data_len)
{
    struct string_buf buf;
    uint32_t flags = 0;
    buf.data = (unsigned char *)p;
    buf.dataptr = buf.data;
    buf.len = data_len;

    if(_libssh2_get_u32(&buf, &flags)) {
        return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
    }
    attrs->flags = flags;

    if(attrs->flags & LIBSSH2_SFTP_ATTR_SIZE) {
        if(_libssh2_get_u64(&buf, &(attrs->filesize))) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }
    }

    if(attrs->flags & LIBSSH2_SFTP_ATTR_UIDGID) {
        uint32_t uid = 0;
        uint32_t gid = 0;
        if(_libssh2_get_u32(&buf, &uid) ||
           _libssh2_get_u32(&buf, &gid)) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }
        attrs->uid = uid;
        attrs->gid = gid;
    }

    if(attrs->flags & LIBSSH2_SFTP_ATTR_PERMISSIONS) {
        uint32_t permissions;
        if(_libssh2_get_u32(&buf, &permissions)) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }
        attrs->permissions = permissions;
    }

    if(attrs->flags & LIBSSH2_SFTP_ATTR_ACMODTIME) {
        uint32_t atime;
        uint32_t mtime;
        if(_libssh2_get_u32(&buf, &atime) ||
           _libssh2_get_u32(&buf, &mtime)) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }
        attrs->atime = atime;
        attrs->mtime = mtime;
    }

    /* Parse extended data, if present, to avoid stream parsing errors */
    if(attrs->flags & LIBSSH2_SFTP_ATTR_EXTENDED) {
        uint32_t extended_count;
        uint32_t i;
        size_t etype_len;
        unsigned char *etype;
        size_t edata_len;
        unsigned char *edata;

        if(_libssh2_get_u32(&buf, &extended_count)) {
            return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
        }

        for(i = 0; i < extended_count; ++i) {
            if(_libssh2_get_string(&buf, &etype, &etype_len) ||
               _libssh2_get_string(&buf, &edata, &edata_len)) {
                return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
            }
        }
    }

    return buf.dataptr - buf.data;
}